

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void instance_destroy(Instance *instance)

{
  Instance *instance_local;
  
  if (instance->name != (char *)0x0) {
    free(instance->name);
  }
  if (instance->comment != (char *)0x0) {
    free(instance->comment);
  }
  free(instance->positions);
  free(instance->demands);
  free(instance->profits);
  free(instance->edge_weight);
  memset(instance,0,0x48);
  return;
}

Assistant:

void instance_destroy(Instance *instance) {
    if (instance->name) {
        free(instance->name);
    }

    if (instance->comment) {
        free(instance->comment);
    }

    free(instance->positions);
    free(instance->demands);
    free(instance->profits);
    free(instance->edge_weight);

    memset(instance, 0, sizeof(*instance));
}